

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttrack.h
# Opt level: O0

ssize_t __thiscall
drace::detector::Fasttrack<std::shared_mutex>::write
          (Fasttrack<std::shared_mutex> *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  TID TVar2;
  TID TVar3;
  VC_ID VVar4;
  VC_ID VVar5;
  Fasttrack<std::shared_mutex> *extraout_RAX;
  Fasttrack<std::shared_mutex> *extraout_RAX_00;
  undefined4 in_register_00000034;
  ThreadState *this_00;
  uint32_t act_tid;
  uint32_t tid;
  size_t addr_local;
  VarState *v_local;
  ThreadState *t_local;
  Fasttrack<std::shared_mutex> *this_local;
  
  this_00 = (ThreadState *)CONCAT44(in_register_00000034,__fd);
  VVar4 = ThreadState::return_own_id(this_00);
  VVar5 = VarState::get_write_id((VarState *)__buf);
  if (VVar4 == VVar5) {
    if ((this->log_flag & 1U) != 0) {
      (this->log_count).write_same_epoch = (this->log_count).write_same_epoch + 1;
    }
  }
  else {
    VVar4 = VarState::get_write_id((VarState *)__buf);
    if (VVar4 == 0) {
      if ((this->log_flag & 1U) != 0) {
        (this->log_count).write_exclusive = (this->log_count).write_exclusive + 1;
      }
      VVar4 = ThreadState::return_own_id(this_00);
      VarState::update((VarState *)__buf,true,VVar4);
      this = extraout_RAX;
    }
    else {
      TVar2 = ThreadState::get_tid(this_00);
      bVar1 = VarState::is_ww_race((VarState *)__buf,this_00);
      if (bVar1) {
        TVar3 = VarState::get_w_tid((VarState *)__buf);
        report_race_locked(this,TVar3,TVar2,true,true,(VarState *)__buf,__n);
      }
      bVar1 = VarState::is_read_shared((VarState *)__buf);
      if (bVar1) {
        if ((this->log_flag & 1U) != 0) {
          (this->log_count).write_shared = (this->log_count).write_shared + 1;
        }
        TVar3 = VarState::is_rw_sh_race((VarState *)__buf,this_00);
        if (TVar3 != 0) {
          report_race_locked(this,TVar3,TVar2,false,true,(VarState *)__buf,__n);
        }
      }
      else {
        if ((this->log_flag & 1U) != 0) {
          (this->log_count).write_exclusive = (this->log_count).write_exclusive + 1;
        }
        bVar1 = VarState::is_rw_ex_race((VarState *)__buf,this_00);
        if (bVar1) {
          TVar2 = VarState::get_r_tid((VarState *)__buf);
          TVar3 = ThreadState::get_tid(this_00);
          report_race_locked(this,TVar2,TVar3,false,true,(VarState *)__buf,__n);
        }
      }
      VVar4 = ThreadState::return_own_id(this_00);
      VarState::update((VarState *)__buf,true,VVar4);
      this = extraout_RAX_00;
    }
  }
  return (ssize_t)this;
}

Assistant:

void write(ThreadState* t, VarState* v, size_t addr) {
    if (t->return_own_id() == v->get_write_id()) {  // write same epoch
      if (log_flag) {
        log_count.write_same_epoch++;
      }
      return;
    }

    if (v->get_write_id() ==
        VarState::VAR_NOT_INIT) {  // initial write, update var
      if (log_flag) {
        log_count.write_exclusive++;
      }
      v->update(true, t->return_own_id());
      return;
    }

    uint32_t tid = t->get_tid();

    // tids are different and write epoch greater or equal than known epoch of
    // other thread
    if (v->is_ww_race(t))  // write-write race
    {
      report_race_locked(v->get_w_tid(), tid, true, true, *v, addr);
    }

    if (!v->is_read_shared()) {
      if (log_flag) {
        log_count.write_exclusive++;
      }
      if (v->is_rw_ex_race(t))  // read-write race
      {
        report_race_locked(v->get_r_tid(), t->get_tid(), false, true, *v, addr);
      }
    } else {  // come here in read shared case
      if (log_flag) {
        log_count.write_shared++;
      }
      uint32_t act_tid = v->is_rw_sh_race(t);
      if (act_tid != 0)  // read shared read-write race
      {
        report_race_locked(act_tid, tid, false, true, *v, addr);
      }
    }
    v->update(true, t->return_own_id());
  }